

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ConcatenationExpression::fromSyntax
          (Compilation *compilation,ConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  undefined1 auVar2 [16];
  bitmask<slang::ast::IntegralFlags> bVar3;
  bool bVar4;
  bool bVar5;
  bitwidth_t bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Expression *pEVar10;
  undefined7 extraout_var;
  Type *pTVar11;
  ExpressionSyntax *pEVar12;
  SourceLocation SVar13;
  Type *pTVar14;
  undefined7 extraout_var_00;
  ConstantRange CVar15;
  Diagnostic *pDVar16;
  undefined4 extraout_var_01;
  Type *pTVar17;
  undefined4 extraout_var_02;
  int iVar18;
  bitmask<slang::ast::ASTFlags> extraFlags;
  undefined8 uVar19;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_02;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_03;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_04;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_05;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_06;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_07;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_08;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_09;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *psVar20;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_10;
  size_t extraout_RDX_11;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *extraout_RDX_12;
  size_t extraout_RDX_13;
  bool bVar21;
  long lVar22;
  Compilation *pCVar23;
  bitwidth_t width;
  bitmask<slang::ast::IntegralFlags> flags;
  ulong uVar24;
  SourceRange SVar25;
  const_iterator __begin3;
  Expression *arg;
  SmallVector<slang::ast::Expression_*,_5UL> buffer;
  bitmask<slang::ast::AssignFlags> *in_stack_ffffffffffffff10;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_d8;
  ConcatenationExpressionSyntax *local_c8;
  ulong local_c0;
  SourceRange local_b8;
  Compilation *local_a8;
  Type *local_a0;
  ulong local_98;
  Expression *local_90;
  SmallVectorBase<slang::ast::Expression_*> local_88 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c8 = syntax;
  if ((assignmentTarget == (Type *)0x0) || (bVar4 = Type::isUnpackedArray(assignmentTarget), !bVar4)
     ) {
    local_88[0].data_ = (pointer)local_88[0].firstElement;
    local_88[0].len = 0;
    pSVar1 = &local_c8->expressions;
    psVar20 = &local_d8;
    local_d8._M_extent._M_extent_value = 0;
    local_88[0].cap = 5;
    local_a0 = (Type *)((local_c8->expressions).elements._M_extent._M_extent_value + 1 >> 1);
    flags.m_bits = '\0';
    width = 0;
    local_c0 = 0;
    local_98 = 0;
    local_d8._M_ptr = (pointer)pSVar1;
    local_a8 = compilation;
    do {
      if (((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_d8._M_ptr == pSVar1) &&
         ((Type *)local_d8._M_extent._M_extent_value == local_a0)) {
        lVar22 = 0;
        uVar24 = 0;
        goto LAB_00469f4f;
      }
      pEVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference
                          ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&local_d8);
      extraFlags.m_bits._1_7_ = 0;
      extraFlags.m_bits._0_1_ = (pEVar12->super_SyntaxNode).kind == MultipleConcatenationExpression;
      SVar13 = (SourceLocation)Expression::create(local_a8,pEVar12,context,extraFlags,(Type *)0x0);
      local_b8.startLoc = SVar13;
      SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_b8);
      bVar4 = Expression::bad((Expression *)local_b8.startLoc);
      pCVar23 = local_a8;
      if (bVar4) goto LAB_0046a403;
      pTVar11 = *(Type **)((long)local_b8.startLoc + 8);
      bVar4 = Type::isVoid(pTVar11);
      bVar3.m_bits = flags.m_bits;
      if ((!bVar4) ||
         (psVar20 = extraout_RDX,
         (pEVar12->super_SyntaxNode).kind != MultipleConcatenationExpression)) {
        bVar4 = Type::isString(pTVar11);
        if (bVar4) {
          local_c0 = CONCAT71(extraout_var,1);
          psVar20 = extraout_RDX_00;
        }
        else {
          bVar4 = Type::isIntegral(pTVar11);
          if (!bVar4) {
            pDVar16 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                          *(SourceRange *)((long)local_b8.startLoc + 0x20));
            ast::operator<<(pDVar16,pTVar11);
            pCVar23 = local_a8;
            goto LAB_0046a403;
          }
          bVar4 = Expression::isUnsizedInteger((Expression *)local_b8.startLoc);
          if (((~bVar4 | (byte)local_98) & 1) == 0) {
            uVar19 = *(undefined8 *)((long)local_b8.startLoc + 0x28);
            pDVar16 = ASTContext::addDiag(context,(DiagCode)0xd80007,
                                          *(SourceRange *)((long)local_b8.startLoc + 0x20));
            bVar6 = Type::getBitWidth(pTVar11);
            local_98 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
            Diagnostic::operator<<<unsigned_int>(pDVar16,bVar6);
          }
          bVar6 = Type::getBitWidth(pTVar11);
          SVar25 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
          width = bVar6 + width;
          bVar4 = ASTContext::requireValidBitWidth(context,width,SVar25);
          pCVar23 = local_a8;
          if (!bVar4) goto LAB_0046a403;
          bVar4 = Type::isFourState(pTVar11);
          psVar20 = extraout_RDX_01;
          bVar3.m_bits = '\x02';
          if (!bVar4) {
            bVar3.m_bits = flags.m_bits;
          }
        }
      }
      flags.m_bits = bVar3.m_bits;
      local_d8._M_extent._M_extent_value = local_d8._M_extent._M_extent_value + 1;
    } while( true );
  }
  bVar4 = Type::isAssociativeArray(assignmentTarget);
  if (bVar4) {
    SVar25 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
    ASTContext::addDiag(context,(DiagCode)0xa60007,SVar25);
    pEVar10 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar10;
  }
  local_a0 = assignmentTarget;
  pTVar11 = Type::getArrayElementType(assignmentTarget);
  bVar4 = Type::isVirtualInterface(pTVar11);
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  pSVar1 = &local_c8->expressions;
  psVar20 = &local_d8;
  local_d8._M_extent._M_extent_value = 0;
  local_88[0].cap = 5;
  local_a8 = (Compilation *)((local_c8->expressions).elements._M_extent._M_extent_value + 1 >> 1);
  local_c0 = 0;
  local_98 = 0;
  bVar21 = false;
  local_d8._M_ptr = (pointer)pSVar1;
  for (; ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_d8._M_ptr != pSVar1 ||
         ((Compilation *)local_d8._M_extent._M_extent_value != local_a8));
      local_d8._M_extent._M_extent_value = local_d8._M_extent._M_extent_value + 1) {
    pEVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
              iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference
                        ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&local_d8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_b8.endLoc;
    local_b8 = (SourceRange)(auVar2 << 0x40);
    if (bVar4) {
      SVar13 = (SourceLocation)Expression::tryBindInterfaceRef(context,pEVar12,false);
      local_b8.startLoc = SVar13;
      if (SVar13 == (SourceLocation)0x0) goto LAB_0046a0f2;
    }
    else {
LAB_0046a0f2:
      SVar13 = (SourceLocation)
               Expression::create(compilation,pEVar12,context,(bitmask<slang::ast::ASTFlags>)0x0,
                                  (Type *)0x0);
      local_b8.startLoc = SVar13;
    }
    bVar5 = Expression::bad((Expression *)SVar13);
    if (bVar5) {
      bVar21 = true;
      psVar20 = extraout_RDX_05;
    }
    else {
      bVar5 = Expression::isImplicitlyAssignableTo
                        ((Expression *)local_b8.startLoc,compilation,pTVar11);
      if (bVar5) {
        SVar25.endLoc = (SourceLocation)0x0;
        SVar25.startLoc = (SourceLocation)*(Symbol **)((long)local_b8.startLoc + 0x28);
        local_90 = Expression::convertAssignment
                             ((Expression *)context,(ASTContext *)pTVar11,(Type *)local_b8.startLoc,
                              (Expression *)*(Scope **)((long)local_b8.startLoc + 0x20),SVar25,
                              (Expression **)0x0,in_stack_ffffffffffffff10);
        SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*>
                  ((SmallVectorBase<slang::ast::Expression*> *)local_88,&local_90);
        local_c0 = local_c0 + 1;
        psVar20 = extraout_RDX_06;
      }
      else {
        pTVar17 = (Type *)((string_view *)((long)local_b8.startLoc + 8))->_M_len;
        bVar5 = Type::isUnpackedArray(pTVar17);
        if (bVar5) {
          pTVar14 = Type::getArrayElementType(pTVar17);
          bVar5 = Type::isAssignmentCompatible(pTVar11,pTVar14);
          if (bVar5) {
            bVar5 = Type::hasFixedRange(pTVar17);
            if (bVar5) {
              CVar15 = Type::getFixedRange(pTVar17);
              iVar7 = CVar15.left;
              iVar18 = CVar15.right;
              iVar9 = iVar7 - iVar18;
              if (iVar7 - iVar18 == 0 || iVar7 < iVar18) {
                iVar9 = -(iVar7 - iVar18);
              }
              local_c0 = local_c0 + (iVar9 + 1);
            }
            else {
              local_98 = CONCAT71(extraout_var_00,1);
            }
            Expression::selfDetermined(context,(Expression **)&local_b8);
            SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                      ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_b8
                      );
            psVar20 = extraout_RDX_08;
            goto LAB_0046a23c;
          }
        }
        pDVar16 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                      *(SourceRange *)((long)local_b8.startLoc + 0x20));
        ast::operator<<(pDVar16,pTVar17);
        Expression::selfDetermined(context,(Expression **)&local_b8);
        SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                  ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_b8);
        bVar21 = true;
        psVar20 = extraout_RDX_07;
      }
    }
LAB_0046a23c:
  }
  if (((local_98 & 1) == 0 && !bVar21) &&
     (bVar4 = Type::hasFixedRange(local_a0), psVar20 = extraout_RDX_09, bVar4)) {
    CVar15 = Type::getFixedRange(local_a0);
    iVar9 = CVar15.left;
    iVar7 = CVar15.right;
    psVar20 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
              (ulong)(uint)-(iVar9 - iVar7);
    uVar8 = iVar9 - iVar7;
    if (iVar9 - iVar7 == 0 || iVar9 < iVar7) {
      uVar8 = -(iVar9 - iVar7);
    }
    if (local_c0 != uVar8 + 1) {
      SVar25 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
      pDVar16 = ASTContext::addDiag(context,(DiagCode)0xa70007,SVar25);
      pDVar16 = ast::operator<<(pDVar16,local_a0);
      CVar15 = Type::getFixedRange(local_a0);
      iVar7 = CVar15.left;
      iVar18 = CVar15.right;
      iVar9 = iVar7 - iVar18;
      if (iVar7 - iVar18 == 0 || iVar7 < iVar18) {
        iVar9 = -(iVar7 - iVar18);
      }
      pDVar16 = Diagnostic::operator<<<unsigned_int>(pDVar16,iVar9 + 1);
      bVar21 = true;
      Diagnostic::operator<<<unsigned_long>(pDVar16,local_c0);
      psVar20 = extraout_RDX_10;
    }
  }
  iVar9 = SmallVectorBase<slang::ast::Expression_*>::copy
                    (local_88,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)psVar20);
  local_d8._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar9);
  local_d8._M_extent._M_extent_value = extraout_RDX_11;
  local_b8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
  pTVar11 = local_a0;
  pTVar14 = (Type *)BumpAllocator::
                    emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                              (&compilation->super_BumpAllocator,local_a0,&local_d8,&local_b8);
  pTVar17 = pTVar14;
  if (bVar21) {
    pTVar17 = (Type *)Expression::badExpr(compilation,(Expression *)pTVar14);
    pTVar11 = pTVar14;
  }
LAB_0046a446:
  SmallVectorBase<slang::ast::Expression_*>::cleanup(local_88,(EVP_PKEY_CTX *)pTVar11);
  return (Expression *)pTVar17;
LAB_00469f4f:
  pCVar23 = local_a8;
  if (local_88[0].len <= uVar24) goto LAB_0046a002;
  if ((local_c0 & 1) == 0) {
    Expression::selfDetermined(context,(Expression **)((long)local_88[0].data_ + lVar22));
    psVar20 = extraout_RDX_03;
  }
  else {
    local_d8._M_ptr = *(pointer *)((long)local_88[0].data_ + lVar22);
    bVar4 = Type::isString((((Expression *)local_d8._M_ptr)->type).ptr);
    if (bVar4) {
      Expression::selfDetermined(context,(Expression **)&local_d8);
      pEVar10 = (Expression *)local_d8._M_ptr;
      psVar20 = extraout_RDX_02;
    }
    else {
      bVar4 = Expression::isImplicitString((Expression *)local_d8._M_ptr);
      if (!bVar4) {
        ASTContext::addDiag(context,(DiagCode)0x420007,
                            *(SourceRange *)((long)local_d8._M_ptr + 0x20));
        pCVar23 = local_a8;
        goto LAB_0046a403;
      }
      local_48 = 0;
      uStack_40 = 0;
      pEVar10 = ConversionExpression::makeImplicit
                          (context,local_a8->stringType,Implicit,(Expression *)local_d8._M_ptr,
                           (Expression *)0x0,(SourceRange)ZEXT816(0));
      psVar20 = extraout_RDX_04;
    }
    *(Expression **)((long)local_88[0].data_ + lVar22) = pEVar10;
  }
  uVar24 = uVar24 + 1;
  lVar22 = lVar22 + 8;
  goto LAB_00469f4f;
LAB_0046a002:
  if (((local_c0 & 1) == 0) && (width == 0)) {
    SVar25 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
    pCVar23 = local_a8;
    ASTContext::addDiag(context,(DiagCode)0x4e0007,SVar25);
LAB_0046a403:
    pTVar11 = pCVar23->errorType;
    local_d8._M_ptr = (pointer)0x0;
    local_d8._M_extent._M_extent_value = 0;
    local_b8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
    pTVar11 = (Type *)BumpAllocator::
                      emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                                (&pCVar23->super_BumpAllocator,pTVar11,
                                 (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                                 &local_d8,&local_b8);
    pTVar17 = (Type *)Expression::badExpr(pCVar23,(Expression *)pTVar11);
  }
  else {
    if ((local_c0 & 1) == 0) {
      pTVar11 = Compilation::getType(local_a8,width,flags);
      psVar20 = extraout_RDX_12;
    }
    else {
      pTVar11 = local_a8->stringType;
    }
    iVar9 = SmallVectorBase<slang::ast::Expression_*>::copy
                      (local_88,(EVP_PKEY_CTX *)pCVar23,(EVP_PKEY_CTX *)psVar20);
    local_d8._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar9);
    local_d8._M_extent._M_extent_value = extraout_RDX_13;
    local_b8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
    pTVar17 = (Type *)BumpAllocator::
                      emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                                (&pCVar23->super_BumpAllocator,pTVar11,&local_d8,&local_b8);
  }
  goto LAB_0046a446;
}

Assistant:

Expression& ConcatenationExpression::fromSyntax(Compilation& compilation,
                                                const ConcatenationExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type* assignmentTarget) {
    // If we are in an assignment-like context with a target type that is an unpacked array,
    // this is an array concatenation (as opposed to a vector or string concatenation).
    if (assignmentTarget && assignmentTarget->isUnpackedArray()) {
        if (assignmentTarget->isAssociativeArray()) {
            context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
            return badExpr(compilation, nullptr);
        }

        bool bad = false;
        bool anyDynamic = false;
        size_t totalElems = 0;
        const Type& type = *assignmentTarget;
        const Type& elemType = *type.getArrayElementType();
        const bool isVirtualIface = elemType.isVirtualInterface();
        SmallVector<Expression*> buffer;

        for (auto argSyntax : syntax.expressions) {
            Expression* arg = nullptr;
            if (isVirtualIface) {
                arg = tryBindInterfaceRef(context, *argSyntax,
                                          /* isInterfacePort */ false);
            }

            if (!arg)
                arg = &create(compilation, *argSyntax, context);

            if (arg->bad()) {
                bad = true;
                continue;
            }

            if (arg->isImplicitlyAssignableTo(compilation, elemType)) {
                buffer.push_back(&convertAssignment(context, elemType, *arg, arg->sourceRange));
                totalElems++;
                continue;
            }

            // The argument can be an unpacked array as long as its element type is
            // assignment compatible with the target.
            auto& argType = *arg->type;
            if (argType.isUnpackedArray() &&
                elemType.isAssignmentCompatible(*argType.getArrayElementType())) {
                // If this is a dynamic array we can't check element counts statically.
                // Otherwise we should count each fixed element in the total.
                if (argType.hasFixedRange())
                    totalElems += argType.getFixedRange().width();
                else
                    anyDynamic = true;

                selfDetermined(context, arg);
                buffer.push_back(arg);
                continue;
            }

            // Otherwise this is an error.
            bad = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << argType;
            selfDetermined(context, arg);
            buffer.push_back(arg);
        }

        // If we have a fixed size source and target, check that they match in size.
        if (!bad && !anyDynamic && type.hasFixedRange() &&
            type.getFixedRange().width() != totalElems) {
            context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
                << type << type.getFixedRange().width() << totalElems;
            bad = true;
        }

        auto result = compilation.emplace<ConcatenationExpression>(type, buffer.ccopy(compilation),
                                                                   syntax.sourceRange());
        if (bad)
            return badExpr(compilation, result);

        return *result;
    }

    bool errored = false;
    bool unsizedWarned = false;
    bool anyStrings = false;
    bitmask<IntegralFlags> flags;
    bitwidth_t totalWidth = 0;
    SmallVector<Expression*> buffer;

    for (auto argSyntax : syntax.expressions) {
        // Replications inside of concatenations have a special feature that allows them to have
        // a width of zero. Check now if we're going to be creating a replication and if so set
        // an additional flag so that it knows it's ok to have that zero count.
        Expression* arg;
        if (argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            arg = &create(compilation, *argSyntax, context, ASTFlags::InsideConcatenation);
        else
            arg = &create(compilation, *argSyntax, context);
        buffer.push_back(arg);

        if (arg->bad()) {
            errored = true;
            break;
        }

        const Type& type = *arg->type;
        if (type.isVoid() && argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            continue;

        if (type.isString()) {
            anyStrings = true;
            continue;
        }

        if (!type.isIntegral()) {
            errored = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << type;
            break;
        }

        if (arg->isUnsizedInteger() && !unsizedWarned) {
            context.addDiag(diag::UnsizedInConcat, arg->sourceRange) << type.getBitWidth();
            unsizedWarned = true;
        }

        // Can't overflow because 2*maxWidth is still less than 2^32-1.
        totalWidth += type.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax.sourceRange())) {
            errored = true;
            break;
        }

        if (type.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (!errored) {
        for (size_t i = 0; i < buffer.size(); i++) {
            if (!anyStrings) {
                selfDetermined(context, buffer[i]);
            }
            else {
                Expression* expr = buffer[i];
                if (expr->type->isString()) {
                    selfDetermined(context, expr);
                }
                else if (expr->isImplicitString()) {
                    expr = &ConversionExpression::makeImplicit(context, compilation.getStringType(),
                                                               ConversionKind::Implicit, *expr,
                                                               nullptr, {});
                }
                else {
                    errored = true;
                    context.addDiag(diag::ConcatWithStringInt, expr->sourceRange);
                    break;
                }
                buffer[i] = expr;
            }
        }

        if (!anyStrings && totalWidth == 0) {
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
            errored = true;
        }
    }

    if (errored) {
        return badExpr(compilation,
                       compilation.emplace<ConcatenationExpression>(compilation.getErrorType(),
                                                                    std::span<const Expression*>(),
                                                                    syntax.sourceRange()));
    }

    const Type* type;
    if (anyStrings)
        type = &compilation.getStringType();
    else
        type = &compilation.getType(totalWidth, flags);

    return *compilation.emplace<ConcatenationExpression>(*type, buffer.ccopy(compilation),
                                                         syntax.sourceRange());
}